

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O2

bool_t zzIsSumEq(word *c,word *a,word *b,size_t n)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar3 = 0;
  for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
    uVar4 = uVar3 + a[sVar1];
    uVar2 = uVar2 | b[sVar1] + uVar4 ^ c[sVar1];
    uVar3 = (ulong)(c[sVar1] < uVar4 || CARRY8(uVar3,a[sVar1]));
  }
  return (bool_t)(uVar3 == 0 && uVar2 == 0);
}

Assistant:

bool_t SAFE(zzIsSumEq)(const word c[], const word a[], const word b[], 
	size_t n)
{
	register word diff = 0;
	register word carry = 0;
	register word w;
	size_t i;
	ASSERT(wwIsValid(a, n));
	ASSERT(wwIsValid(b, n));
	ASSERT(wwIsValid(c, n));
	for (i = 0; i < n; ++i)
	{
		w = a[i] + carry;
		carry = wordLess01(w, carry);
		diff |= c[i] ^ (w + b[i]);
		carry |= wordLess01(c[i], w);
	}
	w = 0;
	return wordEq(diff | carry, 0);
}